

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void __thiscall vkt::sr::anon_unknown_0::ShaderDataSpec::ShaderDataSpec(ShaderDataSpec *this)

{
  long lVar1;
  
  this->resultScale = 1.0;
  this->resultBias = 0.0;
  this->referenceScale = 1.0;
  this->referenceBias = 0.0;
  this->precision = PRECISION_LAST;
  this->output = TYPE_LAST;
  this->numInputs = 0;
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&this->inputs[0].type + lVar1) = 0x5e;
    *(undefined8 *)((long)&this->inputs[0].rangeMin + lVar1) = 0;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x24);
  return;
}

Assistant:

ShaderDataSpec (void)
		: resultScale		(1.0f)
		, resultBias		(0.0f)
		, referenceScale	(1.0f)
		, referenceBias		(0.0f)
		, precision			(PRECISION_LAST)
		, output			(TYPE_LAST)
		, numInputs			(0)
	{
	}